

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,vec<6U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  VectorInfo *pVVar7;
  vec<6U,_float> *pvVar8;
  ulong uVar9;
  double *pdVar10;
  size_type sVar11;
  const_reference pvVar12;
  split_alternative_node_task_params *psVar13;
  task_pool *this_00;
  vq_node *pvVar14;
  undefined4 in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  byte in_R9B;
  float fVar15;
  task_pool *in_stack_00000008;
  uint j;
  vq_node *node;
  uint i_1;
  uint task;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
  params;
  uint alternative_max_splits;
  uint alternative_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  uint splits;
  uint end_node;
  uint begin_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  node_queue;
  uint weight;
  vec<6U,_float> *v;
  uint i;
  task_pool *in_stack_00000240;
  double ttsum;
  vq_node root;
  uint num_tasks;
  undefined4 in_stack_fffffffffffffd48;
  uint in_stack_fffffffffffffd4c;
  vq_node *in_stack_fffffffffffffd50;
  vec<6U,_float> *in_stack_fffffffffffffd58;
  hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
  *this_01;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *in_stack_fffffffffffffd60;
  value_type *in_stack_fffffffffffffd68;
  task_pool *in_stack_fffffffffffffd70;
  bool local_281;
  task_pool *pObject;
  bool local_209;
  float local_1fc;
  float local_1e0;
  uint local_1ac;
  uint local_14c;
  uint local_13c;
  uint local_124;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
  local_120;
  uint local_110;
  uint local_10c;
  NodeInfo local_e4 [3];
  uint local_cc;
  uint local_c8;
  uint local_c4;
  vec<6U,_float> local_9c;
  uint local_84;
  long local_80;
  uint local_74;
  double local_70;
  vec<6U,_float> local_68;
  ulong local_50;
  float local_48;
  undefined4 local_44;
  undefined4 local_40;
  uint local_28;
  byte local_21;
  uint local_20;
  undefined4 local_1c;
  long local_18;
  long local_10;
  
  local_21 = in_R9B & 1;
  *in_RDI = in_RSI;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::resize
            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
             in_stack_fffffffffffffd60,(uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<crnlib::vec<6U,_float>_>::resize
            ((vector<crnlib::vec<6U,_float>_> *)in_stack_fffffffffffffd60,
             (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<double>::resize
            ((vector<double> *)in_stack_fffffffffffffd60,
             (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::resize
            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
             in_stack_fffffffffffffd60,(uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::resize
            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
             in_stack_fffffffffffffd60,(uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<bool>::resize
            ((vector<bool> *)in_stack_fffffffffffffd60,
             (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::resize
            (in_stack_fffffffffffffd60,(uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
  vector<crnlib::vec<6U,_float>_>::clear
            ((vector<crnlib::vec<6U,_float>_> *)in_stack_fffffffffffffd50);
  if (in_stack_00000008 == (task_pool *)0x0) {
    local_1ac = 1;
  }
  else {
    uVar6 = task_pool::get_num_threads(in_stack_00000008);
    local_1ac = uVar6 + 1;
  }
  local_28 = local_1ac;
  vq_node::vq_node(in_stack_fffffffffffffd50);
  local_44 = 0;
  local_40 = local_1c;
  local_70 = 0.0;
  for (local_74 = 0; uVar1 = local_74,
      uVar6 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::size
                        ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                         (in_RDI + 5)), dVar4 = local_70, uVar3 = local_74, uVar1 < uVar6;
      local_74 = local_74 + 1) {
    local_80 = local_10 + (ulong)local_74 * 0x18;
    pVVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                       ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                        (in_RDI + 5),local_74);
    pVVar7->index = uVar3;
    uVar6 = *(uint *)(local_18 + (ulong)local_74 * 4);
    pVVar7 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                       ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                        (in_RDI + 5),local_74);
    pVVar7->weight = uVar6;
    local_84 = uVar6;
    crnlib::operator*(in_stack_fffffffffffffd58,(float)((ulong)in_stack_fffffffffffffd50 >> 0x20));
    pvVar8 = vector<crnlib::vec<6U,_float>_>::operator[]
                       ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),local_74);
    vec<6U,_float>::operator=(pvVar8,&local_9c);
    pvVar8 = vector<crnlib::vec<6U,_float>_>::operator[]
                       ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 1),local_74);
    vec<6U,_float>::operator+=(&local_68,pvVar8);
    local_50 = local_50 + local_84;
    fVar15 = vec<6U,_float>::dot(&in_stack_fffffffffffffd50->m_centroid,
                                 (vec<6U,_float> *)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    uVar9 = (ulong)local_84;
    pdVar10 = vector<double>::operator[]((vector<double> *)(in_RDI + 3),local_74);
    *pdVar10 = (double)(fVar15 * (float)uVar9);
    pdVar10 = vector<double>::operator[]((vector<double> *)(in_RDI + 3),local_74);
    local_70 = *pdVar10 + local_70;
  }
  fVar15 = vec<6U,_float>::dot(&in_stack_fffffffffffffd50->m_centroid,
                               (vec<6U,_float> *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  local_1e0 = (float)local_50;
  local_48 = (float)(dVar4 - (double)(fVar15 / local_1e0));
  local_1fc = (float)local_50;
  vec<6U,_float>::operator*=(&local_68,1.0 / local_1fc);
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6u,float>>::NodeInfo,std::vector<crnlib::tree_clusterizer<crnlib::vec<6u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<6u,float>>::NodeInfo>>,std::less<crnlib::tree_clusterizer<crnlib::vec<6u,float>>::NodeInfo>>
  ::
  priority_queue<std::vector<crnlib::tree_clusterizer<crnlib::vec<6u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<6u,float>>::NodeInfo>>,void>
            ((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
              *)in_stack_fffffffffffffd50);
  local_c4 = 0;
  local_c8 = 0;
  local_cc = 0;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
            ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)(in_RDI + 0x11),0
            );
  vq_node::operator=(in_stack_fffffffffffffd50,
                     (vq_node *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  NodeInfo::NodeInfo(local_e4,local_c8,local_48);
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_c8 = local_c8 + 1;
  local_cc = local_cc + 1;
  if (1 < local_28) {
    while( true ) {
      local_209 = false;
      if (local_cc < local_20) {
        sVar11 = std::
                 priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                 ::size((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                         *)0x1fb5ea);
        local_209 = false;
        if (sVar11 != local_28) {
          local_209 = split_node((tree_clusterizer<crnlib::vec<6U,_float>_> *)
                                 root.m_centroid.m_s._8_8_,
                                 (priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                                  *)root.m_centroid.m_s._0_8_,(uint *)ttsum,in_stack_00000240);
        }
      }
      if (local_209 == false) break;
      local_cc = local_cc + 1;
    }
    sVar11 = std::
             priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
             ::size((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                     *)0x1fb69a);
    if (sVar11 == local_28) {
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                        *)in_stack_fffffffffffffd50,
                       (priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                        *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      local_10c = local_20 * 2;
      local_110 = local_20 / local_28;
      vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
                *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      local_124 = 0;
      while (bVar5 = std::
                     priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                     ::empty((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                              *)0x1fb72a), ((bVar5 ^ 0xffU) & 1) != 0) {
        pvVar12 = std::
                  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                  ::top((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                         *)0x1fb752);
        uVar6 = pvVar12->m_index;
        psVar13 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
                  ::operator[](&local_120,local_124);
        uVar2 = local_10c;
        psVar13->main_node = uVar6;
        psVar13 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
                  ::operator[](&local_120,local_124);
        uVar1 = local_110;
        psVar13->alternative_node = uVar2;
        psVar13 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
                  ::operator[](&local_120,local_124);
        psVar13->max_splits = uVar1;
        this_00 = (task_pool *)(ulong)local_124;
        pObject = in_stack_00000008;
        vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
        ::operator[](&local_120,local_124);
        task_pool::
        queue_object_task<crnlib::tree_clusterizer<crnlib::vec<6u,float>>,void(crnlib::tree_clusterizer<crnlib::vec<6u,float>>::*)(unsigned_long_long,void*)>
                  (this_00,(tree_clusterizer<crnlib::vec<6U,_float>_> *)pObject,
                   (offset_in_tree_clusterizer<crnlib::vec<6U,_float>_>_to_subr)
                   in_stack_fffffffffffffd70,(uint64)in_stack_fffffffffffffd68,
                   in_stack_fffffffffffffd60);
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
               *)in_stack_fffffffffffffd60);
        local_10c = local_110 * 2 + local_10c;
        local_124 = local_124 + 1;
      }
      task_pool::join(in_stack_fffffffffffffd70);
      vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
      ::~vector((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
                 *)in_stack_fffffffffffffd50);
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::~priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                         *)0x1fb90c);
    }
  }
  while( true ) {
    local_281 = false;
    if (local_cc < local_20) {
      local_281 = split_node((tree_clusterizer<crnlib::vec<6U,_float>_> *)root.m_centroid.m_s._8_8_,
                             (priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                              *)root.m_centroid.m_s._0_8_,(uint *)ttsum,in_stack_00000240);
    }
    if (local_281 == false) break;
    local_cc = local_cc + 1;
  }
  for (local_13c = local_c4; local_13c < local_c8; local_13c = local_13c + 1) {
    pvVar14 = vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::operator[]
                        ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node> *)
                         (in_RDI + 0x11),local_13c);
    if (((pvVar14->m_alternative & 1U) != 0) || (pvVar14->m_left == -1)) {
      uVar6 = vector<crnlib::vec<6U,_float>_>::size
                        ((vector<crnlib::vec<6U,_float>_> *)(in_RDI + 0x13));
      pvVar14->m_codebook_index = uVar6;
      vector<crnlib::vec<6U,_float>_>::push_back
                ((vector<crnlib::vec<6U,_float>_> *)in_stack_fffffffffffffd50,
                 (vec<6U,_float> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      if ((local_21 & 1) != 0) {
        for (local_14c = pvVar14->m_begin; local_14c < pvVar14->m_end; local_14c = local_14c + 1) {
          in_stack_fffffffffffffd50 = (vq_node *)(in_RDI + 0xd);
          this_01 = (hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
                     *)*in_RDI;
          vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo>::operator[]
                    ((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                     (in_RDI + 5),local_14c);
          std::make_pair<crnlib::vec<6u,float>&,int&>
                    ((vec<6U,_float> *)this_01,(int *)in_stack_fffffffffffffd50);
          std::pair<crnlib::vec<6U,_float>,_unsigned_int>::pair<crnlib::vec<6U,_float>,_int,_true>
                    ((pair<crnlib::vec<6U,_float>,_unsigned_int> *)in_stack_fffffffffffffd50,
                     (pair<crnlib::vec<6U,_float>,_int> *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
          ::insert(this_01,(value_type *)in_stack_fffffffffffffd50);
        }
      }
    }
  }
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ::~priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                     *)0x1fbb44);
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0) {
    m_vectors = vectors;
    m_vectorsInfo.resize(size);
    m_weightedVectors.resize(size);
    m_weightedDotProducts.resize(size);
    m_vectorsInfoLeft.resize(size);
    m_vectorsInfoRight.resize(size);
    m_vectorComparison.resize(size);
    m_nodes.resize(max_splits << 2);
    m_codebook.clear();
    uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

    vq_node root;
    root.m_begin = 0;
    root.m_end = size;
    double ttsum = 0.0f;
    for (uint i = 0; i < m_vectorsInfo.size(); i++) {
      const VectorType& v = vectors[i];
      m_vectorsInfo[i].index = i;
      const uint weight = m_vectorsInfo[i].weight = weights[i];
      m_weightedVectors[i] = v * (float)weight;
      root.m_centroid += m_weightedVectors[i];
      root.m_total_weight += weight;
      m_weightedDotProducts[i] = v.dot(v) * weight;
      ttsum += m_weightedDotProducts[i];
    }
    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
    root.m_centroid *= (1.0f / root.m_total_weight);

    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = 0, end_node = begin_node, splits = 0;
    m_nodes[end_node] = root;
    node_queue.push(NodeInfo(end_node, root.m_variance));
    end_node++;
    splits++;

    if (num_tasks > 1) {
      while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
        splits++;
      if (node_queue.size() == num_tasks) {
        std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
        uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
        crnlib::vector<split_alternative_node_task_params> params(num_tasks);
        for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++) {
          params[task].main_node = alternative_node_queue.top().m_index;
          params[task].alternative_node = alternative_node;
          params[task].max_splits = alternative_max_splits;
          pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
        }
        pTask_pool->join();
      }
    }

    while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
      splits++;

    for (uint i = begin_node; i < end_node; i++) {
      vq_node& node = m_nodes[i];
      if (!node.m_alternative && node.m_left != -1)
        continue;
      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);
      if (generate_node_index_map) {
        for (uint j = node.m_begin; j < node.m_end; j++)
          m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
      }
    }
  }